

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void __thiscall
Tester::reportError<char_const*,std::__cxx11::string>
          (Tester *this,string *msg,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string local_278;
  char *local_258 [2];
  pointer local_248;
  size_type sStack_240;
  undefined **local_238;
  undefined1 *local_230;
  long lStack_228;
  ulong local_220;
  undefined1 local_218 [504];
  
  format_str.data_ = (msg->_M_dataplus)._M_p;
  format_str.size_ = msg->_M_string_length;
  local_258[0] = *args;
  local_248 = (args_1->_M_dataplus)._M_p;
  sStack_240 = args_1->_M_string_length;
  lStack_228 = 0;
  local_238 = &PTR_grow_001aeda8;
  local_220 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_258;
  args_00.types_ = 0xba;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args_00);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,local_230,local_230 + lStack_228);
  local_238 = &PTR_grow_001aeda8;
  if (local_230 != local_218) {
    operator_delete(local_230,local_220);
  }
  reportError(this,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void reportError(const std::string& msg, Args&&... args) {
    reportError(fmt::format(msg, args...));
  }